

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void parse(ch_compilation *comp,ch_precedence_level prec)

{
  ch_parse_rule *pcVar1;
  ch_parse_func infix;
  ch_parse_func prefix;
  ch_precedence_level prec_local;
  ch_compilation *comp_local;
  
  advance(comp);
  pcVar1 = get_rule((comp->previous).kind);
  if (pcVar1->prefix_parse == (ch_parse_func)0x0) {
    error(comp,"Expected expression");
  }
  else {
    (*pcVar1->prefix_parse)(comp);
    while( true ) {
      pcVar1 = get_rule((comp->current).kind);
      if (pcVar1->prec < prec) break;
      advance(comp);
      pcVar1 = get_rule((comp->previous).kind);
      (*pcVar1->infix_parse)(comp);
    }
  }
  return;
}

Assistant:

void parse(ch_compilation *comp, ch_precedence_level prec) {
  advance(comp);
  ch_parse_func prefix = get_rule(comp->previous.kind)->prefix_parse;
  if (!prefix) {
    error(comp, "Expected expression");
    return;
  }

  prefix(comp);

  while (prec <= get_rule(comp->current.kind)->prec) {
    advance(comp);
    ch_parse_func infix = get_rule(comp->previous.kind)->infix_parse;
    infix(comp);
  }
}